

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O0

void * getbuffer(lua_State *L,int index,size_t *sz)

{
  int iVar1;
  size_t sVar2;
  char *pcStack_30;
  int t;
  void *buffer;
  size_t *sz_local;
  int index_local;
  lua_State *L_local;
  
  iVar1 = lua_type(L,index);
  if (iVar1 == 4) {
    pcStack_30 = lua_tolstring(L,index,sz);
  }
  else {
    if ((iVar1 != 7) && (iVar1 != 2)) {
      luaL_argerror(L,index,"Need a string or userdata");
      return (void *)0x0;
    }
    pcStack_30 = (char *)lua_touserdata(L,index);
    sVar2 = luaL_checkinteger(L,index + 1);
    *sz = sVar2;
  }
  return pcStack_30;
}

Assistant:

static const void *
getbuffer(lua_State *L, int index, size_t *sz) {
	const void * buffer = NULL;
	int t = lua_type(L, index);
	if (t == LUA_TSTRING) {
		buffer = lua_tolstring(L, index, sz);
	} else {
		if (t != LUA_TUSERDATA && t != LUA_TLIGHTUSERDATA) {
			luaL_argerror(L, index, "Need a string or userdata");
			return NULL;
		}
		buffer = lua_touserdata(L, index);
		*sz = luaL_checkinteger(L, index+1);
	}
	return buffer;
}